

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::mulbase(BN *__return_storage_ptr__,BN *this,bt *multiplier)

{
  BN *bn;
  BN local_38;
  bt *local_20;
  bt *multiplier_local;
  BN *this_local;
  
  local_20 = multiplier;
  multiplier_local = (bt *)this;
  this_local = __return_storage_ptr__;
  BN(&local_38,this);
  bn = mulbaseappr(&local_38,local_20);
  BN(__return_storage_ptr__,bn);
  ~BN(&local_38);
  return __return_storage_ptr__;
}

Assistant:

const BN BN::mulbase(const bt &multiplier)const
{
    return move(BN(*this).mulbaseappr(multiplier));
}